

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec7MoveTo(word *t,int v,int p,int *Pla2Var,int *Var2Pla)

{
  int iVar1;
  int v_00;
  int iPlace1;
  int iPlace0;
  int *Var2Pla_local;
  int *Pla2Var_local;
  int p_local;
  int v_local;
  word *t_local;
  
  if (Var2Pla[v] < p) {
    __assert_fail("Var2Pla[v] >= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0x111,"void If_Dec7MoveTo(word *, int, int, int *, int *)");
  }
  while (Var2Pla[v] != p) {
    v_00 = Var2Pla[v] + -1;
    iVar1 = Var2Pla[v];
    If_Dec7SwapAdjacent(t,v_00);
    Var2Pla[Pla2Var[v_00]] = Var2Pla[Pla2Var[v_00]] + 1;
    Var2Pla[Pla2Var[iVar1]] = Var2Pla[Pla2Var[iVar1]] + -1;
    Pla2Var[v_00] = Pla2Var[iVar1] ^ Pla2Var[v_00];
    Pla2Var[iVar1] = Pla2Var[v_00] ^ Pla2Var[iVar1];
    Pla2Var[v_00] = Pla2Var[iVar1] ^ Pla2Var[v_00];
  }
  if (Pla2Var[p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0x11d,"void If_Dec7MoveTo(word *, int, int, int *, int *)");
  }
  return;
}

Assistant:

static inline void If_Dec7MoveTo( word t[2], int v, int p, int Pla2Var[7], int Var2Pla[7] )
{
    int iPlace0, iPlace1;
    assert( Var2Pla[v] >= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_Dec7SwapAdjacent( t, iPlace0 );
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
    }
    assert( Pla2Var[p] == v );
}